

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_clp__is_param(fct_clp_t *clp,char *param)

{
  int iVar1;
  size_t sVar2;
  char *s1;
  char *aparam;
  size_t num_itemsaparam;
  size_t item_iaparam;
  char *param_local;
  fct_clp_t *clp_local;
  
  if (((clp != (fct_clp_t *)0x0) && (param != (char *)0x0)) &&
     (clp != (fct_clp_t *)0xffffffffffffffe8)) {
    sVar2 = fct_nlist__size(&clp->param_list);
    for (num_itemsaparam = 0; num_itemsaparam != sVar2; num_itemsaparam = num_itemsaparam + 1) {
      s1 = (char *)fct_nlist__at(&clp->param_list,num_itemsaparam);
      iVar1 = fctstr_eq(s1,param);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int
fct_clp__is_param(fct_clp_t *clp, char const *param)
{
    if ( clp == NULL || param == NULL )
    {
        return 0;
    }
    FCT_NLIST_FOREACH_BGN(char *, aparam, &(clp->param_list))
    {
        if ( fctstr_eq(aparam, param) )
        {
            return 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return 0;
}